

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
__thiscall
duckdb::FileSystem::ListSubSystems_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *__return_storage_ptr__,FileSystem *this)

{
  NotImplementedException *this_00;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"%s: Can\'t list sub systems on a non-virtual file system","");
  (*this->_vptr_FileSystem[0x27])(&local_40,this);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (this_00,&local_60,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

vector<string> FileSystem::ListSubSystems() {
	throw NotImplementedException("%s: Can't list sub systems on a non-virtual file system", GetName());
}